

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

unit_data __thiscall units::detail::unit_data::add_e_flag(unit_data *this)

{
  unit_data *this_local;
  
  unit_data((unit_data *)((long)&this_local + 4),((int)*this << 0x1c) >> 0x1c,
            ((int)*this << 0x15) >> 0x1d,((int)*this << 0x18) >> 0x1c,((int)*this << 0x12) >> 0x1d,
            ((int)*this << 0xd) >> 0x1d,((int)*this << 0xb) >> 0x1e,((int)*this << 0x10) >> 0x1e,
            ((int)*this << 6) >> 0x1e,((int)*this << 4) >> 0x1e,((int)*this << 8) >> 0x1d,
            (uint)*this >> 0x1c & 1,(uint)*this >> 0x1d & 1,1,(uint)*this >> 0x1f);
  return this_local._4_4_;
}

Assistant:

constexpr unit_data add_e_flag() const
        {
            return {
                meter_,
                kilogram_,
                second_,
                ampere_,
                kelvin_,
                mole_,
                candela_,
                currency_,
                count_,
                radians_,
                per_unit_,
                i_flag_,
                1U,
                equation_};
        }